

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block_graph.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
IRT::getReorderedIndecies
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
          *basicBlocks)

{
  bool bVar1;
  pointer puVar2;
  pointer puVar3;
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  *in_RDX;
  ulong uVar4;
  ulong uVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  labelToBlockIndexMap;
  allocator_type local_82;
  bool local_81;
  vector<bool,_std::allocator<bool>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_58;
  
  buildLabelToBlockIndexMap_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&local_58,(IRT *)basicBlocks,in_RDX);
  local_81 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_80,
             (long)(basicBlocks->
                   super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(basicBlocks->
                   super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,&local_81,&local_82);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (basicBlocks->
           super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((basicBlocks->
      super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == puVar2) {
    uVar4 = 0;
  }
  else {
    uVar5 = 0;
    do {
      if (((local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar5 >> 6 & 0x3ffffff] >> (uVar5 & 0x3f) & 1) ==
           0) && (bVar1 = isCJumpBasicBlock(puVar2[uVar5]._M_t.
                                            super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>
                                            .super__Head_base<0UL,_IRT::CStatementList_*,_false>.
                                            _M_head_impl), bVar1)) {
        dfs((int)uVar5,basicBlocks,
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)&local_58,&local_80,__return_storage_ptr__);
      }
      uVar5 = uVar5 + 1;
      puVar2 = (basicBlocks->
               super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (basicBlocks->
               super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      uVar4 = (long)puVar3 - (long)puVar2 >> 3;
    } while (uVar5 < uVar4);
    if (puVar3 != puVar2) {
      uVar5 = 0;
      do {
        if ((local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar5 >> 6 & 0x3ffffff] >> (uVar5 & 0x3f) & 1)
            == 0) {
          dfs((int)uVar5,basicBlocks,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&local_58,&local_80,__return_storage_ptr__);
          puVar2 = (basicBlocks->
                   super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          puVar3 = (basicBlocks->
                   super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar5 = uVar5 + 1;
        uVar4 = (long)puVar3 - (long)puVar2 >> 3;
      } while (uVar5 < uVar4);
    }
  }
  if ((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 != uVar4) {
    __assert_fail("newOrder.size() == basicBlocks.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                  ,0x84,
                  "std::vector<int> IRT::getReorderedIndecies(const std::vector<std::unique_ptr<CStatementList>> &)"
                 );
  }
  if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> getReorderedIndecies(const std::vector<std::unique_ptr<CStatementList>> &basicBlocks) {
        std::map<std::string, int> labelToBlockIndexMap = buildLabelToBlockIndexMap(basicBlocks);
        std::vector<bool> usedBlocks(basicBlocks.size(), false);

        std::vector<int> newOrder;

        // try use cjumps firstly
        for (int i = 0; i < basicBlocks.size(); ++i) {
            if (usedBlocks[i]) {
                continue;
            }

            if (!isCJumpBasicBlock(basicBlocks[i].get())) {
                continue;
            }

            dfs(i, basicBlocks, labelToBlockIndexMap, usedBlocks, newOrder);
        }

        // add not cjump
        for (int i = 0; i < basicBlocks.size(); ++i) {
            if (usedBlocks[i]) {
                continue;
            }

            dfs(i, basicBlocks, labelToBlockIndexMap, usedBlocks, newOrder);
        }

        assert(newOrder.size() == basicBlocks.size());
        return newOrder;
    }